

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifregroup(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  runsdef *prVar2;
  runcxdef *ctx_00;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int32_t tmp_1;
  uint uVar6;
  uint siz;
  re_group_register *prVar7;
  uint16_t tmp;
  uint uVar8;
  size_t __n;
  runsdef val;
  runsdef local_40;
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x01') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  iVar5 = (int)(ctx_00->runcxsp->runsv).runsvnum;
  if (0xfffffff5 < iVar5 - 0xbU) {
    if (iVar5 <= (ctx->bifcxregex).cur_group) {
      uVar6 = iVar5 - 1;
      pcVar3 = (ctx->bifcxregex).regs[uVar6].start_ofs;
      if (pcVar3 != (char *)0x0) {
        prVar7 = (ctx->bifcxregex).regs + uVar6;
        pcVar4 = (ctx->bifcxregex).regs[uVar6].end_ofs;
        if (pcVar4 != (char *)0x0) {
          __n = (long)pcVar4 - (long)pcVar3;
          uVar8 = (int)__n + 0xf;
          siz = uVar8 & 0xffff;
          if ((uint)(*(int *)&ctx_00->runcxhtop - *(int *)&ctx_00->runcxhp) <= siz) {
            runhcmp(ctx_00,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
          }
          local_40.runstyp = '\a';
          local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
          *(short *)local_40.runsv.runsvstr = (short)uVar8;
          *(uchar *)(local_40.runsv.runsvnum + 2) = '\x01';
          *(int *)(local_40.runsv.runsvnum + 3) =
               (*(int *)&prVar7->start_ofs - *(int *)&(ctx->bifcxregex).strbuf) + 1;
          *(uchar *)(local_40.runsv.runsvnum + 7) = '\x01';
          *(int *)(local_40.runsv.runsvnum + 8) =
               *(int *)&(ctx->bifcxregex).regs[uVar6].end_ofs - *(int *)&prVar7->start_ofs;
          *(uchar *)(local_40.runsv.runsvnum + 0xc) = '\x03';
          *(short *)(local_40.runsv.runsvnum + 0xd) = (short)__n + 2;
          memcpy((uchar *)(local_40.runsv.runsvnum + 0xf),prVar7->start_ofs,__n);
          ppuVar1 = &ctx->bifcxrun->runcxhp;
          *ppuVar1 = *ppuVar1 + siz;
          runrepush(ctx->bifcxrun,&local_40);
          return;
        }
      }
    }
    runpnil(ctx_00);
    return;
  }
  ctx_00->runcxerr->errcxptr->erraav[0].errastr = "reGetGroup";
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
  runsign(ctx->bifcxrun,0x400);
}

Assistant:

void bifregroup(bifcxdef *ctx, int argc)
{
    int grp;
    size_t len;
    re_group_register *reg;
    ushort hplen;
    runsdef val;
    uchar *p;
    long numval;
    
    /* this function takes one parameter: the group number to retrieve */
    bifcntargs(ctx, 1, argc);

    /* get the group number */
    grp = (int)runpopnum(ctx->bifcxrun);

    /* make sure it's within range */
    if (grp < 1 || grp > RE_GROUP_REG_CNT)
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "reGetGroup");

    /* adjust from a 1-bias to an array index */
    --grp;

    /* if the group was never set, return nil */
    if (grp >= ctx->bifcxregex.cur_group)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* get the register */
    reg = &ctx->bifcxregex.regs[grp];

    /* if the group wasn't set, return nil */
    if (reg->start_ofs == 0 || reg->end_ofs == 0)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* calculate the length of the string in this group */
    len = reg->end_ofs - reg->start_ofs;

    /* 
     *   reserve the necessary heap space: two bytes for the list length
     *   prefix, two number elements (one byte each for the type, four
     *   bytes each for the value), and the string element (one byte for
     *   the type, two bytes for the length prefix, plus the string
     *   itself).  
     */
    hplen = (ushort)(2 + 2*(1+4) + (1 + 2 + len));
    runhres(ctx->bifcxrun, hplen, 0);

    /* set up the stack value */
    val.runstyp = DAT_LIST;
    p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* put in the list length prefix */
    oswp2(p, hplen);
    p += 2;

    /* add the starting character position of the group - adjust to 1-bias */
    *p++ = DAT_NUMBER;
    numval = (long)(reg->start_ofs - ctx->bifcxregex.strbuf) + 1;
    oswp4s(p, numval);
    p += 4;

    /* add the length of the group */
    *p++ = DAT_NUMBER;
    numval = (long)(reg->end_ofs - reg->start_ofs);
    oswp4s(p, numval);
    p += 4;

    /* set up the string */
    *p++ = DAT_SSTRING;
    oswp2(p, len+2);
    p += 2;
    memcpy(p, reg->start_ofs, len);

    /* consume the heap space */
    ctx->bifcxrun->runcxhp += hplen;

    /* push the result */
    runrepush(ctx->bifcxrun, &val);
}